

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

uint32_t get_node_max_key(char *node)

{
  long lVar1;
  
  if (*node == '\x01') {
    lVar1 = (ulong)(*(int *)(node + 6) * 0x68 - 0x68) + 10;
  }
  else {
    if (*node != '\0') {
      std::operator<<((ostream *)&std::cout,"UNKNOWN - get_node_max_key");
      exit(1);
    }
    lVar1 = (ulong)(*(int *)(node + 6) * 8 - 8) + 0x1e;
  }
  return *(uint32_t *)(node + lVar1);
}

Assistant:

NodeType get_node_type(char *node) {
	uint8_t value = *((uint8_t*)(node + NODE_TYPE_OFFSET));
	return (NodeType)value;
}